

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rank.cc
# Opt level: O1

Entry * __thiscall rank::Rank::find(Rank *this,Key key)

{
  Entry *pEVar1;
  Entry *pEVar2;
  difference_type __d;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  pEVar2 = (this->_entries).super__Vector_base<rank::Entry,_std::allocator<rank::Entry>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar1 = (this->_entries).super__Vector_base<rank::Entry,_std::allocator<rank::Entry>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar3 = (long)pEVar1 - (long)pEVar2;
  if (0 < (long)uVar3) {
    uVar3 = (uVar3 >> 3) * -0x5555555555555555;
    do {
      uVar4 = uVar3 >> 1;
      uVar5 = uVar4;
      if (pEVar2[uVar4]._key_value._key < key) {
        uVar5 = ~uVar4 + uVar3;
        pEVar2 = pEVar2 + uVar4 + 1;
      }
      uVar3 = uVar5;
    } while (0 < (long)uVar5);
  }
  if (pEVar2 == pEVar1) {
    pEVar1 = (Entry *)0x0;
  }
  else {
    pEVar1 = (Entry *)0x0;
    if ((pEVar2->_key_value)._key == key) {
      pEVar1 = pEVar2;
    }
  }
  return pEVar1;
}

Assistant:

const Entry* Rank::find(Key key) const {
        auto it = std::lower_bound(_entries.begin(), _entries.end(), key, [](const Entry& r, Key key) { return r.key() < key; });
        return (it == _entries.end() || it->key() != key) ? nullptr : &(*it);
    }